

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderDerivateTests.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::sr::anon_unknown_0::TriangleDerivateCaseInstance::iterate
          (TestStatus *__return_storage_ptr__,TriangleDerivateCaseInstance *this)

{
  TextureLevel *this_00;
  TestLog *this_01;
  int iVar1;
  deUint16 *indices_00;
  ConstPixelBufferAccess *access;
  Surface *surface;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  int __fd;
  allocator<char> local_1f4;
  allocator<char> local_1f3;
  allocator<char> local_1f2;
  allocator<char> local_1f1;
  LogImageSet local_1f0;
  Surface errorMask;
  TextureLevel resultImage;
  deUint16 indices [6];
  ConstPixelBufferAccess local_160;
  TextureFormat dataFormat;
  LogImage local_118;
  string local_88;
  string local_68;
  string local_48;
  
  this_01 = ((this->super_ShaderRenderCaseInstance).super_TestInstance.m_context)->m_testCtx->m_log;
  indices[0] = 0;
  indices[1] = 2;
  indices[2] = 1;
  indices[3] = 2;
  indices[4] = 3;
  indices[5] = 1;
  tcu::TextureLevel::TextureLevel(&resultImage);
  (*(this->super_ShaderRenderCaseInstance).super_TestInstance._vptr_TestInstance[4])(this);
  local_118.m_name._M_dataplus._M_p = (pointer)0x3e8000003e000000;
  local_118.m_name._M_string_length = 0x3f8000003f000000;
  indices_00 = indices;
  ShaderRenderCaseInstance::render
            (&this->super_ShaderRenderCaseInstance,4,2,indices_00,(Vec4 *)&local_118);
  this_00 = &(this->super_ShaderRenderCaseInstance).m_resultImage;
  if (this->m_definitions->surfaceType == SURFACETYPE_FLOAT_FBO) {
    dataFormat.order = RGBA;
    dataFormat.type = FLOAT;
    tcu::TextureLevel::setStorage
              (&resultImage,&dataFormat,
               (this->super_ShaderRenderCaseInstance).m_resultImage.m_size.m_data[0],
               (this->super_ShaderRenderCaseInstance).m_resultImage.m_size.m_data[1],1);
    tcu::TextureLevel::getAccess((PixelBufferAccess *)&local_118,&resultImage);
    tcu::TextureLevel::getAccess(&local_160,this_00);
    tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
              ((ConstPixelBufferAccess *)&local_1f0,&dataFormat,
               &(this->super_ShaderRenderCaseInstance).m_resultImage.m_size,local_160.m_data);
    tcu::copy((EVP_PKEY_CTX *)&local_118,(EVP_PKEY_CTX *)&local_1f0);
    indices_00 = (deUint16 *)local_160.m_data;
  }
  else {
    tcu::TextureLevel::operator=(&resultImage,this_00);
  }
  tcu::Surface::Surface(&errorMask,resultImage.m_size.m_data[0],resultImage.m_size.m_data[1]);
  tcu::Surface::getAccess((PixelBufferAccess *)&local_118,&errorMask);
  local_160.m_format.order = 0xff00ff00;
  tcu::RGBA::toVec((RGBA *)&local_160);
  tcu::clear((PixelBufferAccess *)&local_118,(Vec4 *)&local_1f0);
  tcu::TextureLevel::getAccess((PixelBufferAccess *)&local_118,&resultImage);
  tcu::Surface::getAccess((PixelBufferAccess *)&local_1f0,&errorMask);
  iVar1 = (*(this->super_ShaderRenderCaseInstance).super_TestInstance._vptr_TestInstance[7])
                    (this,&local_118,&local_1f0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&dataFormat,"Result",&local_1f1);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"Result images",&local_1f2)
  ;
  tcu::LogImageSet::LogImageSet(&local_1f0,(string *)&dataFormat,&local_88);
  __fd = (int)this_01;
  tcu::LogImageSet::write(&local_1f0,__fd,__buf,(size_t)indices_00);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"Rendered",&local_1f3);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"Rendered image",&local_1f4);
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess(&local_160,&resultImage);
  access = &local_160;
  tcu::LogImage::LogImage(&local_118,&local_48,&local_68,access,QP_IMAGE_COMPRESSION_MODE_BEST);
  tcu::LogImage::write(&local_118,__fd,__buf_00,(size_t)access);
  tcu::LogImage::~LogImage(&local_118);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  tcu::LogImageSet::~LogImageSet(&local_1f0);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&dataFormat);
  if ((char)iVar1 == '\0') {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1f0,"ErrorMask",(allocator<char> *)&dataFormat);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_160,"Error mask",(allocator<char> *)&local_88);
    surface = &errorMask;
    tcu::LogImage::LogImage
              (&local_118,&local_1f0.m_name,(string *)&local_160,surface,
               QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write(&local_118,__fd,__buf_01,(size_t)surface);
    tcu::LogImage::~LogImage(&local_118);
    std::__cxx11::string::~string((string *)&local_160);
    std::__cxx11::string::~string((string *)&local_1f0);
  }
  tcu::TestLog::endImageSet(this_01);
  if ((char)iVar1 == '\0') {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_118,"Image comparison failed",(allocator<char> *)&local_1f0);
    tcu::TestStatus::fail(__return_storage_ptr__,&local_118.m_name);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_118,"Pass",(allocator<char> *)&local_1f0);
    tcu::TestStatus::pass(__return_storage_ptr__,&local_118.m_name);
  }
  std::__cxx11::string::~string((string *)&local_118);
  tcu::Surface::~Surface(&errorMask);
  tcu::TextureLevel::~TextureLevel(&resultImage);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus TriangleDerivateCaseInstance::iterate (void)
{
	tcu::TestLog&				log				= m_context.getTestContext().getLog();
	const deUint32				numVertices		= 4;
	const deUint32				numTriangles	= 2;
	const deUint16				indices[]		= { 0, 2, 1, 2, 3, 1 };
	tcu::TextureLevel			resultImage;

	setup();

	render(numVertices, numTriangles, indices);

	{
		const tcu::TextureLevel&		renderedImage	= getResultImage();

		if (m_definitions.surfaceType == SURFACETYPE_FLOAT_FBO)
		{
			const tcu::TextureFormat	dataFormat		(tcu::TextureFormat::RGBA, tcu::TextureFormat::FLOAT);

			resultImage.setStorage(dataFormat, renderedImage.getWidth(), renderedImage.getHeight());
			tcu::copy(resultImage.getAccess(), tcu::ConstPixelBufferAccess(dataFormat, renderedImage.getSize(), renderedImage.getAccess().getDataPtr()));
		}
		else
		{
			resultImage = renderedImage;
		}
	}

	// Verify
	{
		tcu::Surface errorMask(resultImage.getWidth(), resultImage.getHeight());
		tcu::clear(errorMask.getAccess(), tcu::RGBA::green().toVec());

		const bool isOk = verify(resultImage.getAccess(), errorMask.getAccess());

		log << TestLog::ImageSet("Result", "Result images")
			<< TestLog::Image("Rendered", "Rendered image", resultImage);

		if (!isOk)
			log << TestLog::Image("ErrorMask", "Error mask", errorMask);

		log << TestLog::EndImageSet;

		if (isOk)
			return tcu::TestStatus::pass("Pass");
		else
			return tcu::TestStatus::fail("Image comparison failed");
	}
}